

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_group_ops(ConvolutionDepthWise_x86 *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  size_t sVar3;
  Allocator *pAVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 *puVar9;
  void **ppvVar10;
  _func_int ***ppp_Var11;
  int i;
  uint uVar12;
  pointer ppLVar13;
  Layer *pLVar14;
  long lVar15;
  pointer ppLVar16;
  ulong uVar17;
  int iVar18;
  void *in_R8;
  void *pvVar19;
  _func_int **pp_Var20;
  long lVar21;
  bool bVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ParamDict pd;
  Mat local_2b8;
  undefined1 auStack_270 [12];
  int local_264;
  int local_260;
  int local_25c;
  undefined1 local_258 [44];
  int iStack_22c;
  undefined8 uStack_228;
  int local_220 [2];
  size_t local_218;
  void *local_210;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  int iStack_1f8;
  Allocator *local_1f0;
  uint local_1e8;
  int iStack_1e4;
  undefined8 uStack_1e0;
  uint local_1d8;
  size_t local_1d0;
  _func_int **local_1c8;
  int *piStack_1c0;
  size_t sStack_1b8;
  int iStack_1b0;
  Allocator *local_1a8;
  int local_1a0;
  int iStack_19c;
  int iStack_198;
  int iStack_194;
  int local_190;
  size_t local_188;
  void *local_180;
  int *piStack_178;
  size_t sStack_170;
  int iStack_168;
  Allocator *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_148;
  undefined8 local_140;
  void *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  int iStack_120;
  Allocator *local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_100;
  undefined8 local_f8;
  Mat local_e8;
  undefined8 *local_a0;
  void **local_98;
  int *local_90;
  _func_int ***local_88;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_80;
  size_t local_78;
  Allocator *local_70;
  size_t local_68;
  size_t local_60;
  Mat *local_58;
  size_t local_50;
  Option *local_48;
  ParamDict local_40;
  
  iVar23 = (this->super_ConvolutionDepthWise).num_output;
  iVar18 = (this->super_ConvolutionDepthWise).kernel_h * (this->super_ConvolutionDepthWise).kernel_w
  ;
  iVar24 = (this->super_ConvolutionDepthWise).group;
  uVar17 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)iVar24;
  uVar17 = (long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) / (long)iVar18;
  ppLVar16 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppLVar13 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_48 = opt;
  if (0 < (int)((ulong)((long)ppLVar16 - (long)ppLVar13) >> 3)) {
    lVar21 = 0;
    do {
      if (ppLVar13[lVar21] != (Layer *)0x0) {
        (*ppLVar13[lVar21]->_vptr_Layer[1])();
      }
      lVar21 = lVar21 + 1;
      ppLVar13 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar16 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar21 < (int)((ulong)((long)ppLVar16 - (long)ppLVar13) >> 3));
  }
  local_80 = &this->group_ops;
  if (ppLVar16 != ppLVar13) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar13;
  }
  iVar2 = (this->super_ConvolutionDepthWise).group;
  i = (this->super_ConvolutionDepthWise).num_output / iVar2;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_80,(long)iVar2);
  if (0 < (this->super_ConvolutionDepthWise).group) {
    local_25c = iVar18 * i *
                (((int)((long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) /
                       (long)(iVar23 / iVar24)) * iVar24) / iVar2);
    local_50 = (size_t)local_25c;
    local_60 = (size_t)i;
    local_58 = &(this->super_ConvolutionDepthWise).activation_params;
    local_88 = &local_1c8;
    local_90 = &local_1a0;
    local_98 = &local_180;
    local_a0 = &local_158;
    lVar21 = 0;
    do {
      sVar3 = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      local_258._0_8_ =
           lVar21 * local_50 * sVar3 + (long)(this->super_ConvolutionDepthWise).weight_data.data;
      local_258._24_4_ = (this->super_ConvolutionDepthWise).weight_data.elempack;
      local_258._32_8_ = (this->super_ConvolutionDepthWise).weight_data.allocator;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_258._16_4_ = (undefined4)sVar3;
      local_258._20_4_ = (undefined4)(sVar3 >> 0x20);
      iStack_22c = (int)local_50;
      local_258._40_4_ = 1;
      uStack_228._0_4_ = 1;
      uStack_228._4_4_ = 1;
      local_220[0] = 1;
      local_218 = local_50;
      Mat::clone(&local_e8,(__fn *)local_258,(void *)0x0,1,in_R8);
      piVar5 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
            if ((void *)local_258._0_8_ != (void *)0x0) {
              free((void *)local_258._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_258._32_8_)[3])();
          }
        }
      }
      local_218 = 0;
      local_258._0_8_ = (void *)0x0;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_258._16_4_ = 0;
      local_258._20_4_ = 0;
      local_258._24_4_ = 0;
      stack0xfffffffffffffdd0 = ZEXT816(0);
      local_220[0] = 0;
      bVar22 = (this->super_ConvolutionDepthWise).bias_term == 0;
      if (bVar22) {
        pvVar19 = (void *)0x0;
        local_68 = 0;
        local_260 = 0;
        local_70 = (Allocator *)0x0;
        local_264 = 0;
        local_78 = 0;
      }
      else {
        local_68 = (this->super_ConvolutionDepthWise).bias_data.elemsize;
        pvVar19 = (void *)(lVar21 * local_60 * local_68 +
                          (long)(this->super_ConvolutionDepthWise).bias_data.data);
        local_260 = (this->super_ConvolutionDepthWise).bias_data.elempack;
        local_70 = (this->super_ConvolutionDepthWise).bias_data.allocator;
        local_78 = local_60;
        local_264 = i;
      }
      bVar22 = !bVar22;
      pLVar14 = create_layer_cpu(6);
      ParamDict::ParamDict(&local_40);
      ParamDict::set(&local_40,0,i);
      ParamDict::set(&local_40,1,(this->super_ConvolutionDepthWise).kernel_w);
      ParamDict::set(&local_40,0xb,(this->super_ConvolutionDepthWise).kernel_h);
      ParamDict::set(&local_40,2,(this->super_ConvolutionDepthWise).dilation_w);
      ParamDict::set(&local_40,0xc,(this->super_ConvolutionDepthWise).dilation_h);
      ParamDict::set(&local_40,3,(this->super_ConvolutionDepthWise).stride_w);
      ParamDict::set(&local_40,0xd,(this->super_ConvolutionDepthWise).stride_h);
      ParamDict::set(&local_40,4,0);
      ParamDict::set(&local_40,0xe,0);
      ParamDict::set(&local_40,5,(this->super_ConvolutionDepthWise).bias_term);
      ParamDict::set(&local_40,6,local_25c);
      ParamDict::set(&local_40,8,(this->super_ConvolutionDepthWise).int8_scale_term);
      ParamDict::set(&local_40,9,(this->super_ConvolutionDepthWise).activation_type);
      ParamDict::set(&local_40,10,local_58);
      (*pLVar14->_vptr_Layer[2])(pLVar14,&local_40);
      if ((this->super_ConvolutionDepthWise).bias_term == 0) {
        lVar15 = 0x40;
        do {
          *(undefined8 *)(local_258 + lVar15) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + -0x28) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + -0x20) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + -0x1c) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + -0x14) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + -8) = 0;
          *(undefined8 *)(auStack_270 + lVar15) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + 4) = 0;
          *(undefined8 *)((long)&local_264 + lVar15) = 0;
          lVar15 = lVar15 + 0x48;
        } while (lVar15 != 0x160);
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
              if ((void *)local_258._0_8_ != (void *)0x0) {
                free((void *)local_258._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_258._32_8_)[3])();
            }
          }
        }
        local_258._0_8_ = local_e8.data;
        local_258._8_4_ = local_e8.refcount._0_4_;
        local_258._12_4_ = local_e8.refcount._4_4_;
        local_258._16_4_ = (undefined4)local_e8.elemsize;
        local_258._20_4_ = local_e8.elemsize._4_4_;
        local_258._24_4_ = local_e8.elempack;
        local_258._32_8_ = local_e8.allocator;
        uStack_228._0_4_ = local_e8.h;
        local_258._40_4_ = local_e8.dims;
        iStack_22c = local_e8.w;
        uStack_228._4_4_ = local_e8.d;
        local_220[0] = local_e8.c;
        local_218 = local_e8.cstep;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize._0_4_ = 0;
          local_2b8.elemsize._4_4_ = 0;
          local_2b8.elempack = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
          local_2b8.allocator = (Allocator *)0x0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          Mat::create(&local_2b8,i,4,(Allocator *)0x0);
          auVar8 = _DAT_005f0910;
          auVar7 = _DAT_005f0900;
          auVar6 = _DAT_005f0070;
          uVar12 = local_2b8.c * (int)local_2b8.cstep;
          if (0 < (int)uVar12) {
            uVar1 = *(undefined4 *)
                     ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data +
                     lVar21 * 4);
            lVar15 = (ulong)uVar12 - 1;
            auVar28._8_4_ = (int)lVar15;
            auVar28._0_8_ = lVar15;
            auVar28._12_4_ = (int)((ulong)lVar15 >> 0x20);
            auVar28 = auVar28 ^ _DAT_005f0070;
            uVar17 = 0;
            do {
              auVar26._8_4_ = (int)uVar17;
              auVar26._0_8_ = uVar17;
              auVar26._12_4_ = (int)(uVar17 >> 0x20);
              auVar27 = (auVar26 | auVar8) ^ auVar6;
              iVar23 = auVar28._0_4_;
              bVar22 = iVar23 < auVar27._0_4_;
              iVar24 = auVar28._4_4_;
              iVar18 = auVar27._4_4_;
              if ((bool)(~(iVar24 < iVar18 || iVar18 == iVar24 && bVar22) & 1)) {
                *(undefined4 *)((long)local_2b8.data + uVar17 * 4) = uVar1;
              }
              if (iVar24 >= iVar18 && (iVar18 != iVar24 || !bVar22)) {
                *(undefined4 *)((long)local_2b8.data + uVar17 * 4 + 4) = uVar1;
              }
              auVar26 = (auVar26 | auVar7) ^ auVar6;
              iVar18 = auVar26._4_4_;
              if (iVar18 <= iVar24 && (iVar18 != iVar24 || auVar26._0_4_ <= iVar23)) {
                *(undefined4 *)((long)local_2b8.data + uVar17 * 4 + 8) = uVar1;
                *(undefined4 *)((long)local_2b8.data + uVar17 * 4 + 0xc) = uVar1;
              }
              uVar17 = uVar17 + 4;
            } while ((uVar12 + 3 & 0xfffffffc) != uVar17);
          }
          piVar5 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          piVar5 = (int *)CONCAT44(uStack_204,uStack_208);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_1f0 == (Allocator *)0x0) {
                if (local_210 != (void *)0x0) {
                  free(local_210);
                }
              }
              else {
                (*local_1f0->_vptr_Allocator[3])();
              }
            }
          }
          local_210 = local_2b8.data;
          uStack_208 = local_2b8.refcount._0_4_;
          uStack_204 = local_2b8.refcount._4_4_;
          uStack_200 = (undefined4)local_2b8.elemsize;
          uStack_1fc = local_2b8.elemsize._4_4_;
          iStack_1f8 = local_2b8.elempack;
          local_1f0 = local_2b8.allocator;
          _local_1e8 = CONCAT44(local_2b8.w,local_2b8.dims);
          uStack_1e0 = CONCAT44(local_2b8.d,local_2b8.h);
          local_1d8 = local_2b8.c;
          local_1d0 = local_2b8.cstep;
          sVar3 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pp_Var20 = (_func_int **)
                     (sVar3 * lVar21 +
                     (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          iVar23 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar4 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          if (piStack_1c0 != (int *)0x0) {
            LOCK();
            *piStack_1c0 = *piStack_1c0 + -1;
            UNLOCK();
            if (*piStack_1c0 == 0) {
              if (local_1a8 == (Allocator *)0x0) {
                if (local_1c8 != (_func_int **)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (*local_1a8->_vptr_Allocator[3])();
              }
            }
          }
          ppp_Var11 = local_88;
          *(undefined8 *)((long)local_88 + 0xc) = 0;
          *(undefined8 *)((long)ppp_Var11 + 0x14) = 0;
          *ppp_Var11 = (_func_int **)0x0;
          ppp_Var11[1] = (_func_int **)0x0;
          piVar5 = local_90;
          piVar5[0] = 0;
          piVar5[1] = 0;
          piVar5[2] = 0;
          piVar5[3] = 0;
          piVar5[4] = 0;
          piStack_1c0 = (int *)0x0;
          local_1a0 = 1;
          iStack_19c = 1;
          iStack_198 = 1;
          iStack_194 = 1;
          local_190 = 1;
          local_188 = 1;
          piVar5 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
          local_1c8 = pp_Var20;
          sStack_1b8 = sVar3;
          iStack_1b0 = iVar23;
          local_1a8 = pAVar4;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_2b8.allocator == (Allocator *)0x0) {
                if (local_2b8.data != (void *)0x0) {
                  free(local_2b8.data);
                }
              }
              else {
                (*(local_2b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize._0_4_ = 0;
          local_2b8.elemsize._4_4_ = 0;
          local_2b8.elempack = 0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
        }
        if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
          sVar3 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
          pvVar19 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
          iVar23 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
          pAVar4 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
          if (piStack_178 != (int *)0x0) {
            LOCK();
            *piStack_178 = *piStack_178 + -1;
            UNLOCK();
            if (*piStack_178 == 0) {
              if (local_160 == (Allocator *)0x0) {
                if (local_180 != (void *)0x0) {
                  free(local_180);
                }
              }
              else {
                (*local_160->_vptr_Allocator[3])();
              }
            }
          }
          ppvVar10 = local_98;
          *(undefined8 *)((long)local_98 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar10 + 0x14) = 0;
          *ppvVar10 = (void *)0x0;
          ppvVar10[1] = (void *)0x0;
          puVar9 = local_a0;
          *local_a0 = 0;
          puVar9[1] = 0;
          *(undefined4 *)(puVar9 + 2) = 0;
          piStack_178 = (int *)0x0;
          local_158 = 0x100000001;
          uStack_150 = 0x100000001;
          local_148 = 1;
          local_140 = 1;
          local_180 = (void *)(sVar3 * lVar21 + (long)pvVar19);
          sStack_170 = sVar3;
          iStack_168 = iVar23;
          local_160 = pAVar4;
        }
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2b8,(Mat *)local_258);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_2b8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2b8);
        lVar15 = 0xd8;
        do {
          piVar5 = *(int **)(local_258 + lVar15 + 8);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (*(long **)(local_258 + lVar15 + 0x20) == (long *)0x0) {
                if (*(void **)(local_258 + lVar15) != (void *)0x0) {
                  free(*(void **)(local_258 + lVar15));
                }
              }
              else {
                (**(code **)(**(long **)(local_258 + lVar15 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_218 + lVar15) = 0;
          *(undefined8 *)(local_258 + lVar15 + 0xc) = 0;
          *(undefined8 *)(local_258 + lVar15 + 0x14) = 0;
          *(undefined8 *)(local_258 + lVar15) = 0;
          *(undefined8 *)(local_258 + lVar15 + 8) = 0;
          *(undefined8 *)(local_258 + lVar15 + 0x28) = 0;
          *(undefined8 *)((long)local_220 + lVar15 + -8) = 0;
          *(undefined4 *)((long)local_220 + lVar15) = 0;
          lVar15 = lVar15 + -0x48;
        } while (lVar15 != -0x48);
      }
      else {
        lVar15 = 0x40;
        do {
          *(undefined8 *)(local_258 + lVar15) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + -0x28) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + -0x20) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + -0x1c) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + -0x14) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + -8) = 0;
          *(undefined8 *)(auStack_270 + lVar15) = 0;
          *(undefined8 *)(auStack_270 + lVar15 + 4) = 0;
          *(undefined8 *)((long)&local_264 + lVar15) = 0;
          lVar15 = lVar15 + 0x48;
        } while (lVar15 != 0x1a8);
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
              if ((void *)local_258._0_8_ != (void *)0x0) {
                free((void *)local_258._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_258._32_8_)[3])();
            }
          }
        }
        local_258._0_8_ = local_e8.data;
        local_258._8_4_ = local_e8.refcount._0_4_;
        local_258._12_4_ = local_e8.refcount._4_4_;
        local_258._16_4_ = (undefined4)local_e8.elemsize;
        local_258._20_4_ = local_e8.elemsize._4_4_;
        local_258._24_4_ = local_e8.elempack;
        local_258._32_8_ = local_e8.allocator;
        uStack_228._0_4_ = local_e8.h;
        local_258._40_4_ = local_e8.dims;
        iStack_22c = local_e8.w;
        uStack_228._4_4_ = local_e8.d;
        local_220[0] = local_e8.c;
        local_218 = local_e8.cstep;
        piVar5 = (int *)CONCAT44(uStack_204,uStack_208);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_1f0 == (Allocator *)0x0) {
              if (local_210 != (void *)0x0) {
                free(local_210);
              }
            }
            else {
              (*local_1f0->_vptr_Allocator[3])();
            }
          }
        }
        uStack_208 = 0;
        uStack_204 = 0;
        uStack_200 = (undefined4)local_68;
        uStack_1fc = (undefined4)(local_68 >> 0x20);
        iStack_1f8 = local_260;
        local_1f0 = local_70;
        local_1d8 = (uint)bVar22;
        _local_1e8 = CONCAT44(local_264,local_1d8);
        uStack_1e0 = (ulong)CONCAT14(bVar22,local_1d8);
        local_1d0 = local_78;
        local_210 = pvVar19;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_2b8.cstep = 0;
          local_2b8.data = (_func_int **)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize._0_4_ = 0;
          local_2b8.elemsize._4_4_ = 0;
          local_2b8.elempack = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
          local_2b8.allocator = (Allocator *)0x0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          Mat::create(&local_2b8,i,4,(Allocator *)0x0);
          auVar8 = _DAT_005f0910;
          auVar7 = _DAT_005f0900;
          auVar6 = _DAT_005f0070;
          uVar12 = local_2b8.c * (int)local_2b8.cstep;
          if (0 < (int)uVar12) {
            uVar1 = *(undefined4 *)
                     ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data +
                     lVar21 * 4);
            lVar15 = (ulong)uVar12 - 1;
            auVar27._8_4_ = (int)lVar15;
            auVar27._0_8_ = lVar15;
            auVar27._12_4_ = (int)((ulong)lVar15 >> 0x20);
            uVar17 = 0;
            do {
              auVar25._8_4_ = (int)uVar17;
              auVar25._0_8_ = uVar17;
              auVar25._12_4_ = (int)(uVar17 >> 0x20);
              auVar28 = (auVar25 | auVar8) ^ auVar6;
              iVar23 = SUB164(auVar27 ^ auVar6,0);
              bVar22 = iVar23 < auVar28._0_4_;
              iVar24 = SUB164(auVar27 ^ auVar6,4);
              iVar18 = auVar28._4_4_;
              if ((bool)(~(iVar24 < iVar18 || iVar18 == iVar24 && bVar22) & 1)) {
                *(undefined4 *)((long)local_2b8.data + uVar17 * 4) = uVar1;
              }
              if (iVar24 >= iVar18 && (iVar18 != iVar24 || !bVar22)) {
                *(undefined4 *)((long)local_2b8.data + uVar17 * 4 + 4) = uVar1;
              }
              auVar28 = (auVar25 | auVar7) ^ auVar6;
              iVar18 = auVar28._4_4_;
              if (iVar18 <= iVar24 && (iVar18 != iVar24 || auVar28._0_4_ <= iVar23)) {
                *(undefined4 *)((long)local_2b8.data + uVar17 * 4 + 8) = uVar1;
                *(undefined4 *)((long)local_2b8.data + uVar17 * 4 + 0xc) = uVar1;
              }
              uVar17 = uVar17 + 4;
            } while ((uVar12 + 3 & 0xfffffffc) != uVar17);
          }
          piVar5 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          if (piStack_1c0 != (int *)0x0) {
            LOCK();
            *piStack_1c0 = *piStack_1c0 + -1;
            UNLOCK();
            if (*piStack_1c0 == 0) {
              if (local_1a8 == (Allocator *)0x0) {
                if (local_1c8 != (_func_int **)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (*local_1a8->_vptr_Allocator[3])();
              }
            }
          }
          ppp_Var11 = local_88;
          *(undefined8 *)((long)local_88 + 0xc) = 0;
          *(undefined8 *)((long)ppp_Var11 + 0x14) = 0;
          *ppp_Var11 = (_func_int **)0x0;
          ppp_Var11[1] = (_func_int **)0x0;
          piVar5 = local_90;
          piVar5[0] = 0;
          piVar5[1] = 0;
          piVar5[2] = 0;
          piVar5[3] = 0;
          piVar5[4] = 0;
          piStack_1c0 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
          local_1c8 = (_func_int **)local_2b8.data;
          sStack_1b8 = CONCAT44(local_2b8.elemsize._4_4_,(undefined4)local_2b8.elemsize);
          iStack_1b0 = local_2b8.elempack;
          local_1a8 = local_2b8.allocator;
          local_1a0 = local_2b8.dims;
          iStack_19c = local_2b8.w;
          iStack_198 = local_2b8.h;
          iStack_194 = local_2b8.d;
          local_190 = local_2b8.c;
          local_188 = local_2b8.cstep;
          sVar3 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          pvVar19 = (void *)(sVar3 * lVar21 +
                            (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          iVar23 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
          pAVar4 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          if (piStack_178 != (int *)0x0) {
            LOCK();
            *piStack_178 = *piStack_178 + -1;
            UNLOCK();
            if (*piStack_178 == 0) {
              if (local_160 == (Allocator *)0x0) {
                if (local_180 != (void *)0x0) {
                  free(local_180);
                }
              }
              else {
                (*local_160->_vptr_Allocator[3])();
              }
            }
          }
          ppvVar10 = local_98;
          *(undefined8 *)((long)local_98 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar10 + 0x14) = 0;
          *ppvVar10 = (void *)0x0;
          ppvVar10[1] = (void *)0x0;
          puVar9 = local_a0;
          *local_a0 = 0;
          puVar9[1] = 0;
          *(undefined4 *)(puVar9 + 2) = 0;
          piStack_178 = (int *)0x0;
          local_158 = 0x100000001;
          uStack_150 = 0x100000001;
          local_148 = 1;
          local_140 = 1;
          piVar5 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
          local_180 = pvVar19;
          sStack_170 = sVar3;
          iStack_168 = iVar23;
          local_160 = pAVar4;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_2b8.allocator == (Allocator *)0x0) {
                if ((_func_int **)local_2b8.data != (_func_int **)0x0) {
                  free(local_2b8.data);
                }
              }
              else {
                (*(local_2b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize._0_4_ = 0;
          local_2b8.elemsize._4_4_ = 0;
          local_2b8.elempack = 0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
        }
        if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
          sVar3 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
          pvVar19 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
          iVar23 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
          pAVar4 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
          piVar5 = (int *)CONCAT44(uStack_12c,uStack_130);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_118 == (Allocator *)0x0) {
                if (local_138 != (void *)0x0) {
                  free(local_138);
                }
              }
              else {
                (*local_118->_vptr_Allocator[3])();
              }
            }
          }
          uStack_130 = 0;
          uStack_12c = 0;
          uStack_128 = (undefined4)sVar3;
          uStack_124 = (undefined4)(sVar3 >> 0x20);
          local_110 = 0x100000001;
          uStack_108 = 0x100000001;
          local_100 = 1;
          local_f8 = 1;
          local_138 = (void *)(sVar3 * lVar21 + (long)pvVar19);
          iStack_120 = iVar23;
          local_118 = pAVar4;
        }
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2b8,(Mat *)local_258);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_2b8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2b8);
        lVar15 = 0x120;
        do {
          piVar5 = *(int **)(local_258 + lVar15 + 8);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (*(long **)(local_258 + lVar15 + 0x20) == (long *)0x0) {
                if (*(void **)(local_258 + lVar15) != (void *)0x0) {
                  free(*(void **)(local_258 + lVar15));
                }
              }
              else {
                (**(code **)(**(long **)(local_258 + lVar15 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_218 + lVar15) = 0;
          *(undefined8 *)(local_258 + lVar15 + 0xc) = 0;
          *(undefined8 *)(local_258 + lVar15 + 0x14) = 0;
          *(undefined8 *)(local_258 + lVar15) = 0;
          *(undefined8 *)(local_258 + lVar15 + 8) = 0;
          *(undefined8 *)(local_258 + lVar15 + 0x28) = 0;
          *(undefined8 *)((long)local_220 + lVar15 + -8) = 0;
          *(undefined4 *)((long)local_220 + lVar15) = 0;
          lVar15 = lVar15 + -0x48;
        } while (lVar15 != -0x48);
      }
      (*pLVar14->_vptr_Layer[4])(pLVar14,local_48);
      (local_80->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar21] = pLVar14;
      ParamDict::~ParamDict(&local_40);
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.elemsize._4_4_ = 0;
      local_e8.elempack = 0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      lVar21 = lVar21 + 1;
    } while (lVar21 < (this->super_ConvolutionDepthWise).group);
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}